

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusFogMode::emulate_mthd(MthdCelsiusFogMode *this)

{
  uint local_18;
  uint local_14;
  uint32_t rv;
  uint32_t err;
  MthdCelsiusFogMode *this_local;
  
  local_14 = 0;
  if ((this->super_SingleMthdTest).super_MthdTest.val == 0x800) {
    local_18 = 1;
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.val == 0x801) {
    local_18 = 3;
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.val == 0x802) {
    local_18 = 5;
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.val == 0x803) {
    local_18 = 7;
  }
  else {
    local_14 = (uint)((this->super_SingleMthdTest).super_MthdTest.val != 0x2601);
    local_18 = 0;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = local_14 | 4;
  }
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c &
           0xfffffff8 | local_18;
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		uint32_t rv = 0;
		if (val == 0x800) {
			rv = 1;
		} else if (val == 0x801) {
			rv = 3;
		} else if (val == 0x802) {
			rv = 5;
		} else if (val == 0x803) {
			rv = 7;
		} else if (val == 0x2601) {
			rv = 0;
		} else {
			err |= 1;
		}
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_config_c, 0, 3, rv);
			}
		}
	}